

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::Uniform::Uniform
          (Uniform *this,UniformValueGenerator *generator,UniformType *_type,Loc _location,
          DefOccurence _declOccurence,DefOccurence _usageOccurence)

{
  Loc _location_00;
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  LayoutSpecifierBase LVar5;
  UniformType local_310;
  Uniform local_280;
  LayoutSpecifierBase local_a8;
  LayoutSpecifierBase local_94;
  LayoutSpecifierBase local_88;
  undefined8 local_74;
  Loc childLocation;
  size_t child;
  int local_58;
  int arrayElem;
  int currentLocation;
  UniformType *_type_local;
  UniformValueGenerator *generator_local;
  Uniform *this_local;
  DefOccurence _usageOccurence_local;
  DefOccurence _declOccurence_local;
  Loc _location_local;
  
  UniformType::UniformType(&this->type,_type);
  (this->location).super_LayoutSpecifierBase.occurence.occurence =
       _location.super_LayoutSpecifierBase.occurence.occurence.occurence;
  (this->location).super_LayoutSpecifierBase.val = (int)_location.super_LayoutSpecifierBase._0_8_;
  (this->location).super_LayoutSpecifierBase.numSys =
       (int)((ulong)_location.super_LayoutSpecifierBase._0_8_ >> 0x20);
  (this->declOccurence).occurence = _declOccurence.occurence;
  (this->usageOccurence).occurence = _usageOccurence.occurence;
  UniformValue::UniformValue(&this->value,_type,generator);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector(&this->childUniforms);
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->shortName);
  bVar2 = UniformType::isStruct(&this->type);
  if (bVar2) {
    local_58 = (this->location).super_LayoutSpecifierBase.val;
    for (child._4_4_ = 0; child._4_4_ < (this->type).arraySize; child._4_4_ = child._4_4_ + 1) {
      childLocation.super_LayoutSpecifierBase.numSys = Dec;
      childLocation.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
      while( true ) {
        uVar1 = childLocation.super_LayoutSpecifierBase._4_8_;
        sVar3 = std::
                vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                ::size(&(this->type).childTypes);
        if (sVar3 <= (ulong)uVar1) break;
        LVar5 = (LayoutSpecifierBase)
                LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
        childLocation.super_LayoutSpecifierBase.val = (int)LVar5.occurence.occurence;
        local_74 = LVar5._0_8_;
        local_88 = LVar5;
        if (0 < local_58) {
          LVar5 = (LayoutSpecifierBase)
                  LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(local_58,Dec);
          local_a8 = LVar5;
          local_94 = LVar5;
        }
        childLocation.super_LayoutSpecifierBase.val = (int)LVar5.occurence.occurence;
        local_74 = LVar5._0_8_;
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ::operator[](&(this->type).childTypes,childLocation.super_LayoutSpecifierBase._4_8_
                             );
        UniformType::UniformType(&local_310,pvVar4);
        _location_00.super_LayoutSpecifierBase.occurence.occurence =
             childLocation.super_LayoutSpecifierBase.val;
        _location_00.super_LayoutSpecifierBase.val = (undefined4)local_74;
        _location_00.super_LayoutSpecifierBase.numSys = local_74._4_4_;
        Uniform(&local_280,generator,&local_310,_location_00,
                (DefOccurence)(this->declOccurence).occurence,
                (DefOccurence)(this->usageOccurence).occurence);
        std::
        vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
        ::push_back(&this->childUniforms,&local_280);
        ~Uniform(&local_280);
        UniformType::~UniformType(&local_310);
        pvVar4 = std::
                 vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
                 ::operator[](&(this->type).childTypes,childLocation.super_LayoutSpecifierBase._4_8_
                             );
        local_58 = pvVar4->arraySize + local_58;
        childLocation.super_LayoutSpecifierBase._4_8_ =
             childLocation.super_LayoutSpecifierBase._4_8_ + 1;
      }
    }
  }
  return;
}

Assistant:

Uniform(UniformValueGenerator& generator, UniformType _type, Loc _location,
			DefOccurence _declOccurence = DefOccurence::ALL_SH, DefOccurence _usageOccurence = DefOccurence::ALL_SH)
		: type(_type)
		, location(_location)
		, declOccurence(_declOccurence)
		, usageOccurence(_usageOccurence)
		, value(_type, generator)
	{

		if (type.isStruct())
		{
			int currentLocation = location.val;
			for (int arrayElem = 0; arrayElem < type.arraySize; arrayElem++)
			{
				for (size_t child = 0; child < type.childTypes.size(); child++)
				{
					Loc childLocation = Loc::Implicit();
					if (currentLocation > 0)
					{
						childLocation = Loc::C(currentLocation);
					}
					childUniforms.push_back(
						Uniform(generator, type.childTypes[child], childLocation, declOccurence, usageOccurence));
					currentLocation += type.childTypes[child].arraySize;
				}
			}
		}
	}